

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  uint uVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImRect IVar5;
  
  IVar5 = ImGuiWindow::Rect(window);
  fVar2 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  IVar3.y = IVar5.Max.y;
  IVar3.x = IVar5.Max.x;
  if (axis == ImGuiAxis_X) {
    fVar2 = (IVar3.y - window->WindowBorderSize) - fVar2;
    uVar1 = -(uint)(fVar2 <= IVar5.Min.y);
    IVar4.y = (float)(uVar1 & (uint)IVar5.Min.y | ~uVar1 & (uint)fVar2);
    IVar4.x = (window->InnerRect).Min.x;
    IVar3.x = (window->InnerRect).Max.x;
  }
  else {
    fVar2 = (IVar3.x - window->WindowBorderSize) - fVar2;
    uVar1 = -(uint)(fVar2 <= IVar5.Min.x);
    IVar4.x = (float)(uVar1 & (uint)IVar5.Min.x | ~uVar1 & (uint)fVar2);
    IVar4.y = (window->InnerRect).Min.y;
    IVar3.y = (window->InnerRect).Max.y;
  }
  IVar5.Max = IVar3;
  IVar5.Min = IVar4;
  return IVar5;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}